

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O1

void __thiscall QTimer::timerEvent(QTimer *this,QTimerEvent *e)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  long in_FS_OFFSET;
  undefined1 local_29;
  void *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (e->m_id == (TimerId)pQVar1[1].children.d.size) {
    pQVar2 = (pQVar1->bindingStorage).bindingStatus;
    if ((pQVar2 != (QBindingStatus *)0x0) &&
       (pQVar2->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper
                (&pQVar1->bindingStorage,(QUntypedPropertyData *)&pQVar1[1].metaObject);
    }
    if (*(char *)&pQVar1[1].metaObject == '\x01') {
      stop(this);
    }
    local_28 = (void *)0x0;
    puStack_20 = &local_29;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimer::timerEvent(QTimerEvent *e)
{
    Q_D(QTimer);
    if (e->id() == d->id) {
        if (d->single)
            stop();
        emit timeout(QPrivateSignal());
    }
}